

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O0

basic_bigint<std::allocator<unsigned_char>_> *
jsoncons::operator-(basic_bigint<std::allocator<unsigned_char>_> *x,int64_t y)

{
  basic_bigint<std::allocator<unsigned_char>_> *in_RDI;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_000000b0;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_000000b8;
  long in_stack_ffffffffffffffa8;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [8];
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  
  basic_bigint<std::allocator<unsigned_char>_>::basic_bigint<long>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,local_40);
  basic_bigint<std::allocator<unsigned_char>_>::operator-=(in_stack_000000b8,in_stack_000000b0);
  basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_RDI);
  return in_RDI;
}

Assistant:

friend basic_bigint<Allocator> operator-( basic_bigint<Allocator> x, int64_t y )
    {
        return x -= y;
    }